

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cc
# Opt level: O0

void __thiscall prometheus::Histogram::Reset(Histogram *this)

{
  size_type sVar1;
  reference this_00;
  ulong local_20;
  size_t i;
  lock_guard<std::mutex> lock;
  Histogram *this_local;
  
  lock._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&i,&this->mutex_);
  local_20 = 0;
  while( true ) {
    sVar1 = std::vector<prometheus::Counter,_std::allocator<prometheus::Counter>_>::size
                      (&this->bucket_counts_);
    if (sVar1 <= local_20) break;
    this_00 = std::vector<prometheus::Counter,_std::allocator<prometheus::Counter>_>::operator[]
                        (&this->bucket_counts_,local_20);
    Counter::Reset(this_00);
    local_20 = local_20 + 1;
  }
  Gauge::Set(&this->sum_,0.0);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&i);
  return;
}

Assistant:

void Histogram::Reset() {
  std::lock_guard<std::mutex> lock(mutex_);
  for (std::size_t i = 0; i < bucket_counts_.size(); ++i) {
    bucket_counts_[i].Reset();
  }
  sum_.Set(0);
}